

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlen.c
# Opt level: O0

int vflen(char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int local_200;
  undefined8 *local_1f0;
  int local_1d8;
  long *local_1d0;
  int local_1b8;
  undefined8 *local_1b0;
  long local_190;
  char *local_188;
  double *local_180;
  int local_160;
  int local_158;
  ulong local_150;
  int *local_140;
  int local_128;
  int *local_120;
  long *local_108;
  long *local_f0;
  int *local_d8;
  int local_c0;
  long local_b0;
  int *local_a8;
  int *local_90;
  char *s;
  long lStack_68;
  int arg_size;
  long conv_len;
  long conv_len2;
  long conv_len1;
  char *endp;
  double d;
  long lStack_38;
  int i;
  longlong l;
  char *pcStack_28;
  char c;
  char *cp;
  __va_list_tag *p_Stack_18;
  int len;
  __va_list_tag *ap_local;
  char *fmt_local;
  
  cp._4_4_ = 0;
  pcStack_28 = fmt;
  p_Stack_18 = ap;
  ap_local = (__va_list_tag *)fmt;
  do {
    if (*pcStack_28 == '\0') {
      return cp._4_4_ + 1;
    }
    if (*pcStack_28 != '\0') {
      if (*pcStack_28 == '%') {
        conv_len2 = 0;
        conv_len = 0;
        while( true ) {
          pcVar4 = pcStack_28 + 1;
          l._7_1_ = pcStack_28[1];
          pcStack_28 = pcVar4;
          if (l._7_1_ == '\0') break;
          if (l._7_1_ == '#') {
            cp._4_4_ = cp._4_4_ + 2;
          }
          else {
            if (((l._7_1_ != '-') && (l._7_1_ != '+')) && (l._7_1_ != ' ')) break;
            cp._4_4_ = cp._4_4_ + 1;
          }
        }
        lStack_38 = strtol(pcVar4,(char **)&conv_len1,10);
        if ((char *)conv_len1 == pcStack_28) {
          if (*pcStack_28 == '*') {
            uVar1 = p_Stack_18->gp_offset;
            if (uVar1 < 0x29) {
              local_90 = (int *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
              p_Stack_18->gp_offset = uVar1 + 8;
            }
            else {
              local_90 = (int *)p_Stack_18->overflow_arg_area;
              p_Stack_18->overflow_arg_area = local_90 + 2;
            }
            conv_len2 = (long)*local_90;
            pcStack_28 = pcStack_28 + 1;
          }
        }
        else {
          pcStack_28 = (char *)conv_len1;
          conv_len2 = lStack_38;
        }
        lStack_68 = conv_len2;
        if (*pcStack_28 == '.') {
          pcStack_28 = pcStack_28 + 1;
          conv_len = strtol(pcStack_28,(char **)&conv_len1,10);
          if ((char *)conv_len1 == pcStack_28) {
            if (*pcStack_28 == '*') {
              uVar1 = p_Stack_18->gp_offset;
              if (uVar1 < 0x29) {
                local_a8 = (int *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
                p_Stack_18->gp_offset = uVar1 + 8;
              }
              else {
                local_a8 = (int *)p_Stack_18->overflow_arg_area;
                p_Stack_18->overflow_arg_area = local_a8 + 2;
              }
              conv_len = (long)*local_a8;
              pcStack_28 = pcStack_28 + 1;
            }
          }
          else {
            pcStack_28 = (char *)conv_len1;
          }
          if (conv_len < conv_len2) {
            local_b0 = conv_len2;
          }
          else {
            local_b0 = conv_len;
          }
          lStack_68 = local_b0;
        }
        if (*pcStack_28 == 'h') {
          s._4_4_ = -1;
          pcVar4 = pcStack_28 + 1;
        }
        else if (*pcStack_28 == 'l') {
          s._4_4_ = 1;
          pcVar4 = pcStack_28 + 1;
          if (pcStack_28[1] == 'l') {
            s._4_4_ = 2;
            pcVar4 = pcStack_28 + 2;
          }
        }
        else {
          s._4_4_ = 0;
          pcVar4 = pcStack_28;
        }
        pcStack_28 = pcVar4;
        local_128 = (int)lStack_68;
        local_c0 = (int)conv_len2;
        switch(*pcStack_28) {
        case '%':
          if (conv_len2 < 2) {
            local_c0 = 1;
          }
          cp._4_4_ = cp._4_4_ + local_c0;
          break;
        default:
          break;
        case 'E':
        case 'G':
        case 'e':
        case 'g':
          uVar1 = p_Stack_18->fp_offset;
          if (uVar1 < 0xa1) {
            local_1b0 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
            p_Stack_18->fp_offset = uVar1 + 0x10;
          }
          else {
            local_1b0 = (undefined8 *)p_Stack_18->overflow_arg_area;
            p_Stack_18->overflow_arg_area = local_1b0 + 1;
          }
          endp = (char *)*local_1b0;
          local_1b8 = local_128;
          if (lStack_68 < 0xe) {
            local_1b8 = 0xd;
          }
          cp._4_4_ = cp._4_4_ + local_1b8;
          break;
        case 'X':
        case 'a':
        case 'd':
        case 'i':
        case 'u':
        case 'x':
          if (s._4_4_ == -1) {
            uVar1 = p_Stack_18->gp_offset;
            if (uVar1 < 0x29) {
              local_d8 = (int *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
              p_Stack_18->gp_offset = uVar1 + 8;
            }
            else {
              local_d8 = (int *)p_Stack_18->overflow_arg_area;
              p_Stack_18->overflow_arg_area = local_d8 + 2;
            }
            lStack_38 = (long)*local_d8;
          }
          else if (s._4_4_ == 1) {
            uVar1 = p_Stack_18->gp_offset;
            if (uVar1 < 0x29) {
              local_f0 = (long *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
              p_Stack_18->gp_offset = uVar1 + 8;
            }
            else {
              local_f0 = (long *)p_Stack_18->overflow_arg_area;
              p_Stack_18->overflow_arg_area = local_f0 + 1;
            }
            lStack_38 = *local_f0;
          }
          else if (s._4_4_ == 2) {
            uVar1 = p_Stack_18->gp_offset;
            if (uVar1 < 0x29) {
              local_108 = (long *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
              p_Stack_18->gp_offset = uVar1 + 8;
            }
            else {
              local_108 = (long *)p_Stack_18->overflow_arg_area;
              p_Stack_18->overflow_arg_area = local_108 + 1;
            }
            lStack_38 = *local_108;
          }
          else {
            uVar1 = p_Stack_18->gp_offset;
            if (uVar1 < 0x29) {
              local_120 = (int *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
              p_Stack_18->gp_offset = uVar1 + 8;
            }
            else {
              local_120 = (int *)p_Stack_18->overflow_arg_area;
              p_Stack_18->overflow_arg_area = local_120 + 2;
            }
            lStack_38 = (long)*local_120;
          }
          if (lStack_68 < 0x18) {
            local_128 = 0x17;
          }
          cp._4_4_ = cp._4_4_ + local_128;
          break;
        case 'c':
          uVar1 = p_Stack_18->gp_offset;
          if (uVar1 < 0x29) {
            local_140 = (int *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
            p_Stack_18->gp_offset = uVar1 + 8;
          }
          else {
            local_140 = (int *)p_Stack_18->overflow_arg_area;
            p_Stack_18->overflow_arg_area = local_140 + 2;
          }
          d._4_4_ = *local_140;
          if (d._4_4_ < 0x80) {
            local_150 = 1;
          }
          else {
            local_150 = __ctype_get_mb_cur_max();
          }
          local_158 = local_c0;
          if ((ulong)conv_len2 <= local_150) {
            if (d._4_4_ < 0x80) {
              local_160 = 1;
            }
            else {
              sVar3 = __ctype_get_mb_cur_max();
              local_160 = (int)sVar3;
            }
            local_158 = local_160;
          }
          cp._4_4_ = cp._4_4_ + local_158;
          break;
        case 'f':
          uVar1 = p_Stack_18->fp_offset;
          if (uVar1 < 0xa1) {
            local_180 = (double *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
            p_Stack_18->fp_offset = uVar1 + 0x10;
          }
          else {
            local_180 = (double *)p_Stack_18->overflow_arg_area;
            p_Stack_18->overflow_arg_area = local_180 + 1;
          }
          endp = (char *)*local_180;
          local_188 = endp;
          if ((double)endp <= 0.0) {
            local_188 = (char *)((ulong)endp ^ 0x8000000000000000);
          }
          iVar2 = 0xf;
          if (1000000.0 < (double)local_188) {
            iVar2 = 0x13d;
          }
          local_190 = (long)iVar2;
          if (local_190 <= conv_len2 + 2) {
            local_190 = conv_len2 + 2;
          }
          lStack_38 = local_190;
          if (conv_len != 0) {
            lStack_38 = conv_len + -6 + local_190;
          }
          cp._4_4_ = cp._4_4_ + (int)lStack_38;
          break;
        case 'n':
          break;
        case 'p':
          uVar1 = p_Stack_18->gp_offset;
          if (uVar1 < 0x29) {
            local_1d0 = (long *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
            p_Stack_18->gp_offset = uVar1 + 8;
          }
          else {
            local_1d0 = (long *)p_Stack_18->overflow_arg_area;
            p_Stack_18->overflow_arg_area = local_1d0 + 1;
          }
          lStack_38 = *local_1d0;
          local_1d8 = local_128;
          if (lStack_68 < 0x15) {
            local_1d8 = 0x14;
          }
          cp._4_4_ = cp._4_4_ + local_1d8;
          break;
        case 's':
          uVar1 = p_Stack_18->gp_offset;
          if (uVar1 < 0x29) {
            local_1f0 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_18->reg_save_area);
            p_Stack_18->gp_offset = uVar1 + 8;
          }
          else {
            local_1f0 = (undefined8 *)p_Stack_18->overflow_arg_area;
            p_Stack_18->overflow_arg_area = local_1f0 + 1;
          }
          pcVar4 = (char *)*local_1f0;
          if (conv_len == 0) {
            sVar3 = strlen(pcVar4);
            local_200 = local_128;
            if (lStack_68 <= (int)sVar3) {
              sVar3 = strlen(pcVar4);
              local_200 = (int)sVar3;
            }
            cp._4_4_ = cp._4_4_ + local_200;
          }
          else {
            cp._4_4_ = cp._4_4_ + local_128;
          }
        }
      }
      else {
        cp._4_4_ = cp._4_4_ + 1;
      }
    }
    pcStack_28 = pcStack_28 + 1;
  } while( true );
}

Assistant:

int vflen(char *fmt, va_list ap)
{
    int len = 0;
    char *cp, c;
    long long l;
    int i;
    double d; 

    /*
     * This code modifies 'ap', but we do not know if va_list is a structure
     * or a pointer to an array so we do not know if it is a local variable
     * or not.
     * C99 gets around this by defining va_copy() to make copies of ap, but
     * this does not exist on all systems.
     * For now, I just assume that when va_list is a pointer the system also
     * provides a va_copy macro to work around this problem. The only system
     * I have seen needing this so far was Linux on AMD64.
     */
#if defined(HAVE_VA_COPY)
    va_list ap_local;
    va_copy(ap_local, ap);
#    define ap ap_local
#endif

    for(cp = fmt; *cp; cp++) {
	switch(*cp) {

	/* A format specifier */
	case '%': {
	    char *endp;
	    long conv_len1=0, conv_len2=0, conv_len=0;
	    signed int arg_size;

	    /* Firstly, strip the modifier flags (+-#0 and [space]) */
	    for(; (c=*++cp);) {
		if ('#' == c)
		    len+=2; /* Worst case of "0x" */
		else if ('-' == c || '+' == c || ' ' == c)
		    len++;
		else
		    break;
	    }

	    /* Width specifier */
	    l = strtol(cp, &endp, 10);
	    if (endp != cp) {
		cp = endp;
		conv_len = conv_len1 = l;
	    } else if (*cp == '*') {
		conv_len = conv_len1 = (int)va_arg(ap, int);
		cp++;
	    }

	    /* Precision specifier */
	    if ('.' == *cp) {
		cp++;
		conv_len2 = strtol(cp, &endp, 10);
		if (endp != cp) {
		    cp = endp;
		} else if (*cp == '*') {
		    conv_len2 = (int)va_arg(ap, int);
		    cp++;
		}
		conv_len = MAX(conv_len1, conv_len2);
	    }

	    /* Short/long identifier */
	    if ('h' == *cp) {
		arg_size = -1; /* short */
		cp++;
	    } else if ('l' == *cp) {
		arg_size = 1; /* long */
		cp++;
		if ('l' == *cp) {
		    arg_size = 2; /* long long */
		    cp++;
		}
	    } else {
		arg_size = 0; /* int */
	    }

	    /* The actual type */
	    switch (*cp) {
	    case '%':
		/*
		 * Not real ANSI I suspect, but we'll allow for the
		 * completely daft "%10%" example.
		 */
		len += MAX(conv_len1, 1);
		break;

	    case 'd':
	    case 'i':
	    case 'u':
	    case 'a':
	    case 'x':
	    case 'X':
		/* Remember: char and short are sent as int on the stack */
		if (arg_size == -1)
		    l = (long)va_arg(ap, int);
		else if (arg_size == 1)
		    l = va_arg(ap, long); 
		else if (arg_size == 2)
		    l = va_arg(ap, long long); 
		else 
		    l = (long)va_arg(ap, int);

		DEBUG_printf("%d", l);

		/*
		 * No number can be more than 24 characters so we'll take
		 * the max of conv_len and 24 (23 is len(2^64) in octal).
		 * All that work above and we then go and estimate ;-),
		 * but it's needed incase someone does %500d.
		 */
		len += MAX(conv_len, 23);
		break;

	    case 'c':
		i = va_arg(ap, int);
		DEBUG_printf("%c", i);
		/*
		 * Note that %10c and %.10c act differently.
		 * Besides, I think precision is not really allowed for %c.
		 */
		len += MAX(conv_len1, i>=0x80 ?MB_CUR_MAX :1);
		break;

	    case 'f':
		d = va_arg(ap, double);
		DEBUG_printf("%f", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that.
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double. The worst case I can
		 * think of is 317 characters (-1[308 zeros].000000)
		 * without using precision codes. That's horrid. I
		 * cheat and either use 317 or 15 depending on how
		 * large the number is as I reckon 99% of floats
		 * aren't that long.
		 */
		l = (ABS(d) > 1000000) ? 317 : 15;
		l = MAX(l, conv_len1 + 2);
		if (conv_len2) l += conv_len2 - 6;
		len += l;
		break;

	    case 'e':
	    case 'E':
	    case 'g':
	    case 'G':
		d = va_arg(ap, double);
		DEBUG_printf("%g", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double (which defaults to only
		 * '-' + 6 + '.' + 'E[+-]xxx' == 13.
		 */
		len += MAX(conv_len, 13);
		break;

	    case 'p':
		l = (long)va_arg(ap, void *);
		/*
		 * Max pointer is 64bits == 16 chars (on alpha),
		 * == 20 with + "0x".
		 */
		DEBUG_printf("%p", (void *)l);
		len += MAX(conv_len, 20);
		break;

	    case 'n':
		/* produces no output */
		break;

	    case 's': {
		char *s = (char *)va_arg(ap, char *);
		DEBUG_printf("%s", s);

		if (!conv_len2) {
		    len += MAX(conv_len, (int)strlen(s));
		} else {
		    len += conv_len;
		}
		break;
	    }

	    default:
		/* wchar_t types of 'C' and 'S' aren't supported */
		DEBUG_printf("Arg is %c\n", *cp);
	    }
	    
	}

	case '\0':
	    break;

	default:
	    DEBUG_printf("%c", *cp);
	    len++;
	}
    }

    va_end(ap);

    return len+1; /* one for the null character */
}